

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O2

bool __thiscall HACD::ICHUll::AddPoints(ICHUll *this,Vec3<double> *points,size_t nPoints)

{
  double dVar1;
  CircularListElement<HACD::TMMVertex> *pCVar2;
  double *pdVar3;
  size_t sVar4;
  
  if (points != (Vec3<double> *)0x0) {
    pdVar3 = points->m_data + 2;
    for (sVar4 = 0; nPoints != sVar4; sVar4 = sVar4 + 1) {
      pCVar2 = TMMesh::AddVertex(&this->m_mesh);
      (pCVar2->m_data).m_pos.m_data[0] = ((Vec3<double> *)(pdVar3 + -2))->m_data[0];
      (pCVar2->m_data).m_pos.m_data[1] = pdVar3[-1];
      dVar1 = *pdVar3;
      pdVar3 = pdVar3 + 3;
      (pCVar2->m_data).m_pos.m_data[2] = dVar1;
      (pCVar2->m_data).m_name = sVar4;
    }
  }
  return points != (Vec3<double> *)0x0;
}

Assistant:

bool ICHUll::AddPoints(const Vec3<Real> * points, size_t nPoints)
	{
		if (!points)
		{
			return false;
		}
		CircularListElement<TMMVertex> * vertex = NULL;
		for (size_t i = 0; i < nPoints; i++)
		{
			vertex = m_mesh.AddVertex();
			vertex->GetData().m_pos.X() = points[i].X();
			vertex->GetData().m_pos.Y() = points[i].Y();
			vertex->GetData().m_pos.Z() = points[i].Z();
            vertex->GetData().m_name = static_cast<long>(i);
		}     
		return true;
	}